

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Args::run(Args *this)

{
  string *__source;
  char cVar1;
  char cVar2;
  int iVar3;
  DynamicFormat *pDVar4;
  long lVar5;
  path *__p;
  runtime_error *this_00;
  bool bVar6;
  undefined1 auVar7 [16];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator __end1;
  string_view extension;
  path path;
  recursive_directory_iterator local_218;
  recursive_directory_iterator local_208;
  recursive_directory_iterator local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  Args *local_1d8;
  recursive_directory_iterator local_1d0;
  recursive_directory_iterator local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  path local_1a0;
  path local_178;
  undefined1 local_150 [248];
  path local_58;
  
  if (this->recursive == false) {
    run_once(this);
    return;
  }
  __source = &this->input_dir;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_150,__source,auto_format);
  cVar1 = std::filesystem::status((path *)local_150);
  bVar6 = true;
  if ((cVar1 != '\0') && (cVar1 != -1)) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_178,__source,auto_format);
    cVar2 = std::filesystem::status(&local_178);
    bVar6 = cVar2 != '\x02';
  }
  if ((cVar1 != '\0') && (cVar1 != -1)) {
    std::filesystem::__cxx11::path::~path(&local_178);
  }
  std::filesystem::__cxx11::path::~path((path *)local_150);
  if (bVar6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Input directory doesn\'t exist!");
  }
  else if ((this->input_format)._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Recursive run needs input format!");
  }
  else {
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150);
    pDVar4 = get_format(&this->input_format,(string_view)(ZEXT816(0x142284) << 0x40),
                        (string *)local_150);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    local_1b0 = (basic_string_view<char,_std::char_traits<char>_>)
                (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4);
    lVar5 = (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4);
    if (lVar5 != 0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_150,__source,auto_format);
      std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
                (&local_218,(path *)local_150,none,(error_code *)0x0);
      std::filesystem::__cxx11::path::~path((path *)local_150);
      if (local_218._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
         ) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_218._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_218._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_218._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_218._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_208._M_dirs._M_ptr = local_218._M_dirs._M_ptr;
      local_208._M_dirs._M_refcount._M_pi = local_218._M_dirs._M_refcount._M_pi;
      local_1c0._M_dirs._M_ptr = (element_type *)0x0;
      local_1c0._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_1c0);
      local_1d0._M_dirs._M_ptr = local_218._M_dirs._M_ptr;
      local_1d0._M_dirs._M_refcount._M_pi = local_218._M_dirs._M_refcount._M_pi;
      if (local_218._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
         ) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_218._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_218._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_218._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_218._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_1f8._M_dirs._M_ptr = (element_type *)0x0;
      local_1f8._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_1d0);
      local_1e0 = &this->input_file;
      local_1d8 = this;
      while (local_208._M_dirs._M_refcount._M_pi != local_1f8._M_dirs._M_refcount._M_pi) {
        __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_208);
        cVar1 = *(char *)&__p[1]._M_pathname._M_dataplus._M_p;
        if ((cVar1 == '\x03') || (cVar1 == '\0')) {
          cVar1 = std::filesystem::status(__p);
        }
        if (cVar1 == '\x01') {
          std::filesystem::__cxx11::path::path(&local_58,__p);
          auVar7 = std::filesystem::__cxx11::path::_M_find_extension();
          if (auVar7._8_8_ == 0xffffffffffffffff ||
              auVar7._0_8_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::filesystem::__cxx11::path::path((path *)local_150);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_1a0._M_pathname,auVar7._0_8_,auVar7._8_8_,0xffffffffffffffff);
            std::filesystem::__cxx11::path::path
                      ((path *)local_150,&local_1a0._M_pathname,auto_format);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_pathname._M_dataplus._M_p != &local_1a0._M_pathname.field_2) {
              operator_delete(local_1a0._M_pathname._M_dataplus._M_p,
                              local_1a0._M_pathname.field_2._M_allocated_capacity + 1);
            }
          }
          std::filesystem::__cxx11::path::
          path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                    (&local_1a0,&local_1b0,auto_format);
          iVar3 = std::filesystem::__cxx11::path::compare((path *)local_150);
          std::filesystem::__cxx11::path::~path(&local_1a0);
          std::filesystem::__cxx11::path::~path((path *)local_150);
          if (iVar3 == 0) {
            std::filesystem::__cxx11::path::
            generic_string<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,&local_58,(allocator<char> *)&local_1a0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(local_1e0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
                     );
            if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
              operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
            }
            Args((Args *)local_150,local_1d8);
            run_once((Args *)local_150);
            ~Args((Args *)local_150);
          }
          std::filesystem::__cxx11::path::~path(&local_58);
        }
        std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_208);
      }
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_1f8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_208);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_218);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Format must have default extension!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run() {
        if (!recursive) {
            return run_once();
        }

        if (!fs::exists(input_dir) || !fs::is_directory(input_dir)) {
            throw std::runtime_error("Input directory doesn't exist!");
        }

        if (input_format.empty()) {
            throw std::runtime_error("Recursive run needs input format!");
        }

        auto const format = get_format(input_format, "", "");
        if (!format) {
            throw std::runtime_error("No format found for recursive run!");
        }

        auto const extension = format->default_extension();
        if (format->default_extension().empty()) {
            throw std::runtime_error("Format must have default extension!");
        }

        for (auto const& entry: fs::recursive_directory_iterator(input_dir)) {
            if (!entry.is_regular_file()) {
                continue;
            }
            auto const path = entry.path();
            if (path.extension() != extension) {
                continue;
            }
            this->input_file = path.generic_string();
            Args {*this}.run_once();
        }
    }